

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O1

void __thiscall
asmjit::v1_14::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  ZoneVectorBase *__dest;
  uint uVar4;
  ulong uVar5;
  uint extraout_EDX;
  uint sizeOfT;
  ulong uVar6;
  undefined4 in_register_00000034;
  ZoneVectorBase *this_00;
  ZoneAllocator *allocator;
  ZoneVectorBase *this_01;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uStack_40;
  
  this_00 = (ZoneVectorBase *)CONCAT44(in_register_00000034,side);
  uVar5 = (ulong)side;
  plVar2 = *(long **)(this + uVar5 * 8 + 8);
  if (plVar2[2] == plVar2[3]) {
    this_00 = (ZoneVectorBase *)plVar2[side == 0];
    if (this_00 == (ZoneVectorBase *)0x0) {
      if (*(long **)(this + (ulong)(side == 0) * 8 + 8) == plVar2) {
        plVar2[2] = middleIndex + (long)plVar2;
        plVar2[3] = middleIndex + (long)plVar2;
      }
      return;
    }
    if ((long *)(&this_00->_data)[uVar5] != plVar2) goto LAB_0012cf25;
    plVar3 = *(long **)this;
    if (*plVar3 == 0) goto LAB_0012cf2a;
    if (plVar2 != (long *)0x0) {
      *plVar2 = plVar3[10];
      plVar3[10] = (long)plVar2;
      (&this_00->_data)[uVar5] = (void *)0x0;
      *(ZoneVectorBase **)(this + uVar5 * 8 + 8) = this_00;
      return;
    }
  }
  else {
    _cleanupBlock();
LAB_0012cf25:
    _cleanupBlock();
LAB_0012cf2a:
    _cleanupBlock();
  }
  _cleanupBlock();
  uVar1 = *(uint *)(this + 0xc);
  uVar4 = (uint)uVar5;
  if (uVar4 <= uVar1) {
    return;
  }
  if (this_00->_data == (void *)0x0) {
    ZoneVectorBase::_reserve();
    return;
  }
  uVar9 = (ulong)extraout_EDX;
  allocator = (ZoneAllocator *)((uVar5 & 0xffffffff) * uVar9);
  this_01 = this_00;
  __dest = (ZoneVectorBase *)
           ZoneAllocator::_alloc((ZoneAllocator *)this_00,(size_t)allocator,&uStack_40);
  if (__dest == (ZoneVectorBase *)0x0) {
    return;
  }
  uVar10 = (uint)(uStack_40 / uVar9);
  if (uVar10 < uVar4) {
    ZoneVectorBase::_reserve();
LAB_0012cfff:
    ZoneVectorBase::_reserve();
  }
  else {
    allocator = *(ZoneAllocator **)this;
    if ((allocator == (ZoneAllocator *)0x0) || ((ulong)*(uint *)(this + 8) == 0)) {
LAB_0012cfa4:
      *(ZoneVectorBase **)this = __dest;
      *(uint *)(this + 0xc) = uVar10;
      return;
    }
    this_01 = __dest;
    memcpy(__dest,allocator,*(uint *)(this + 8) * uVar9);
    if (this_00->_data == (void *)0x0) goto LAB_0012cfff;
    if (uVar1 != 0) {
      ZoneVectorBase::_reserve();
      goto LAB_0012cfa4;
    }
  }
  ZoneVectorBase::_reserve();
  if ((uint)uVar5 <= this_01->_capacity) {
    return;
  }
  uVar7 = (ulong)sizeOfT;
  uVar8 = this_01->_capacity * uVar7;
  uVar6 = (uVar5 & 0xffffffff) * uVar7;
  uVar9 = 0x20;
  if (((0x1f < uVar8) && (uVar9 = 0x80, 0x7f < uVar8)) && (uVar9 = 0x200, 0x200 < uVar8)) {
    uVar9 = uVar8;
  }
  if (uVar9 < uVar6) {
    uVar9 = uVar6 - 1 >> 1 | uVar6 - 1;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    uVar9 = uVar9 >> 0x10 | uVar9;
    uVar9 = (uVar9 >> 0x20 | uVar9) + 1;
    if (uVar9 < uVar6) goto LAB_0012d0bf;
    if (0x1000000 < uVar9) {
      uVar9 = ((uint)uVar6 & 0xffffff) + uVar6;
    }
  }
  uVar5 = 0xffffffff;
  if (uVar9 / uVar7 < 0xffffffff) {
    uVar5 = uVar9 / uVar7;
  }
LAB_0012d0bf:
  ZoneVectorBase::_reserve(this_01,allocator,sizeOfT,(uint32_t)uVar5);
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}